

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::Str::ltrim(string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  string *local_10;
  string *str_local;
  
  local_10 = str;
  local_20._M_current = (char *)::std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_18,&local_20);
  uVar1 = ::std::__cxx11::string::begin();
  uVar2 = ::std::__cxx11::string::end();
  local_30 = ::std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,el::base::utils::Str::ltrim(std::__cxx11::string&)::__0>
                       (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  ::std::__cxx11::string::erase(str,local_18,local_28);
  return local_10;
}

Assistant:

std::string& Str::ltrim(std::string& str) {
  str.erase(str.begin(), std::find_if(str.begin(), str.end(), [](char c) {
    return !std::isspace(c);
  } ));
  return str;
}